

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PpContext.h
# Opt level: O2

void __thiscall glslang::TPpContext::tMacroInput::~tMacroInput(tMacroInput *this)

{
  ~tMacroInput(this);
  operator_delete(this,0x68);
  return;
}

Assistant:

virtual ~tMacroInput()
        {
            for (size_t i = 0; i < args.size(); ++i)
                delete args[i];
            for (size_t i = 0; i < expandedArgs.size(); ++i)
                delete expandedArgs[i];
        }